

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O0

int FmsMetaDataSetMetaData(FmsMetaData mdata,char *mdata_name,FmsInt size,FmsMetaData **data)

{
  int iVar1;
  void *pvVar2;
  undefined8 *in_RCX;
  ulong in_RDX;
  ulong uVar3;
  undefined4 *in_RDI;
  FmsMetaData md;
  FmsInt i;
  FmsMetaData *md_data;
  char *name_copy;
  int err;
  void *local_58;
  char **in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  ulong uVar4;
  FmsMetaData in_stack_ffffffffffffffc8;
  
  if (in_RDI == (undefined4 *)0x0) {
    return 1;
  }
  iVar1 = FmsMetaDataClear(in_stack_ffffffffffffffc8);
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = FmsCopyString(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  if (iVar1 != 0) {
    return 2;
  }
  if (in_RDX == 0) {
    local_58 = (void *)0x0;
  }
  else {
    local_58 = malloc(in_RDX << 3);
    if (local_58 == (void *)0x0) {
      free(in_stack_ffffffffffffffc8);
      return 2;
    }
  }
  uVar4 = 0;
  while( true ) {
    if (in_RDX <= uVar4) {
      *(FmsMetaData *)(in_RDI + 2) = in_stack_ffffffffffffffc8;
      *in_RDI = 3;
      *(ulong *)(in_RDI + 4) = in_RDX;
      *(void **)(in_RDI + 6) = local_58;
      *in_RCX = local_58;
      return 0;
    }
    pvVar2 = calloc(1,0x20);
    if (pvVar2 == (void *)0x0) break;
    *(void **)((long)local_58 + uVar4 * 8) = pvVar2;
    uVar4 = uVar4 + 1;
  }
  while (uVar4 != 0) {
    uVar3 = uVar4 - 1;
    free(*(void **)((long)local_58 + uVar4 * 8 + -8));
    uVar4 = uVar3;
  }
  free(local_58);
  free(in_stack_ffffffffffffffc8);
  return 2;
}

Assistant:

int FmsMetaDataSetMetaData(FmsMetaData mdata, const char *mdata_name,
                           FmsInt size, FmsMetaData **data) {
  if (!mdata) { E_RETURN(1); }
  int err = FmsMetaDataClear(mdata);
  if (err) { E_RETURN(err); }
  char *name_copy;
  if (FmsCopyString(mdata_name, &name_copy)) { E_RETURN(2); }
  // On error, call free(name_copy)
  FmsMetaData *md_data = size ? malloc(size*sizeof(*md_data)) : NULL;
  if (size && md_data == NULL) { free(name_copy); E_RETURN(2); }
  // On error, call free(md_data)
  for (FmsInt i = 0; i < size; i++) {
    FmsMetaData md;
    md = calloc(1, sizeof(*md));
    if (md == NULL) {
      while (i != 0) { free(md_data[--i]); }
      free(md_data);
      free(name_copy);
      E_RETURN(2);
    }
    md_data[i] = md;
  }
  // Update mdata
  mdata->name = name_copy;
  mdata->md_type = FMS_META_DATA;
  mdata->num_entries = size;
  mdata->data = md_data;
  *data = md_data;
  return 0;
}